

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O1

Variant * Jinx::operator%(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  int64_t iVar1;
  int64_t iVar2;
  char *format;
  double dVar3;
  double __y;
  
  if ((left->m_type != Number) && (right->m_type != Number)) {
    if (left->m_type == Integer) {
      if (right->m_type == Integer) {
        iVar1 = Variant::GetInteger(left);
        iVar2 = Variant::GetInteger(right);
        __return_storage_ptr__->m_type = Null;
        Variant::Destroy(__return_storage_ptr__);
        __return_storage_ptr__->m_type = Integer;
        (__return_storage_ptr__->field_1).m_integer = (iVar1 % iVar2 + iVar2) % iVar2;
        return __return_storage_ptr__;
      }
      format = "Invalid right operand for mod";
    }
    else {
      format = "Invalid left operand for mod";
    }
    Impl::LogWriteLine(Error,format);
    __return_storage_ptr__->m_type = Null;
    return __return_storage_ptr__;
  }
  dVar3 = Variant::GetNumber(left);
  __y = Variant::GetNumber(right);
  dVar3 = fmod(dVar3,__y);
  dVar3 = fmod(dVar3 + __y,__y);
  __return_storage_ptr__->m_type = Null;
  Variant::Destroy(__return_storage_ptr__);
  __return_storage_ptr__->m_type = Number;
  (__return_storage_ptr__->field_1).m_number = dVar3;
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator % (const Variant & left, const Variant & right)
	{
		// Handle floating-point numbers with fmod function
		if (left.GetType() == ValueType::Number || right.GetType() == ValueType::Number)
		{
			auto l = left.GetNumber();
			auto r = right.GetNumber();
			return fmod(fmod(l, r) + r, r);
		}

		// Check for non-integer types, especially since co-erced right values will be zero
		if (left.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for mod");
			return Variant();
		}
		if (right.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for mod");
			return Variant();
		}

		// Return result from integer mod operation
		auto l = left.GetInteger();
		auto r = right.GetInteger();
		return ((l % r) + r) % r;
	}